

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void re2c::output_yyaccept_init(ostream *o,uint32_t ind,bool used_yyaccept)

{
  ostream *poVar1;
  opt_t *poVar2;
  undefined3 in_register_00000011;
  string local_38;
  undefined1 local_15;
  uint32_t local_14;
  bool used_yyaccept_local;
  ostream *poStack_10;
  uint32_t ind_local;
  ostream *o_local;
  
  if (used_yyaccept) {
    local_15 = used_yyaccept;
    local_14 = ind;
    poStack_10 = o;
    indent_abi_cxx11_(&local_38,(re2c *)(ulong)ind,CONCAT31(in_register_00000011,used_yyaccept));
    poVar1 = std::operator<<(o,(string *)&local_38);
    poVar1 = std::operator<<(poVar1,"unsigned int ");
    poVar2 = Opt::operator->((Opt *)&opts);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yyaccept);
    std::operator<<(poVar1," = 0;\n");
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void output_yyaccept_init (std::ostream & o, uint32_t ind, bool used_yyaccept)
{
	if (used_yyaccept)
	{
		o << indent (ind) << "unsigned int " << opts->yyaccept << " = 0;\n";
	}
}